

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void * __thiscall
c4::MemoryResource::reallocate
          (MemoryResource *this,void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  
  pvVar3 = (void *)(**(code **)(*(long *)this + 0x18))();
  if (pvVar3 != (void *)0x0) {
    return pvVar3;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      pvVar3 = (void *)(*pcVar1)();
      return pvVar3;
    }
  }
  handle_error(0x1fab37,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0xccc,oldsz,newsz);
}

Assistant:

void* reallocate(void* ptr, size_t oldsz, size_t newsz, size_t alignment=alignof(max_align_t))
    {
        void *mem = this->do_reallocate(ptr, oldsz, newsz, alignment);
        C4_CHECK_MSG(mem != nullptr, "could not reallocate from %lu to %lu bytes", oldsz, newsz);
        return mem;
    }